

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

void __thiscall wasm::StackIROptimizer::removeAt(StackIROptimizer *this,Index i)

{
  value_type pSVar1;
  Expression *pEVar2;
  StackInst *inst_00;
  bool bVar3;
  reference ppSVar4;
  size_type sVar5;
  Expression *origin;
  StackInst *inst;
  Index i_local;
  StackIROptimizer *this_local;
  
  ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                      (this->insts,(ulong)i);
  pSVar1 = *ppSVar4;
  ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                      (this->insts,(ulong)i);
  *ppSVar4 = (value_type)0x0;
  if (pSVar1->op != Basic) {
    pEVar2 = pSVar1->origin;
    inst._4_4_ = i;
    do {
      inst._4_4_ = inst._4_4_ + 1;
      sVar5 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::size(this->insts);
      if (sVar5 <= inst._4_4_) {
        __assert_fail("i < insts.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                      ,0x172,"void wasm::StackIROptimizer::removeAt(Index)");
      }
      ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                          (this->insts,(ulong)inst._4_4_);
      inst_00 = *ppSVar4;
      ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                          (this->insts,(ulong)inst._4_4_);
      *ppSVar4 = (value_type)0x0;
    } while (((inst_00 == (StackInst *)0x0) || (inst_00->origin != pEVar2)) ||
            (bVar3 = isControlFlowEnd(this,inst_00), !bVar3));
  }
  return;
}

Assistant:

void StackIROptimizer::removeAt(Index i) {
  auto* inst = insts[i];
  insts[i] = nullptr;
  if (inst->op == StackInst::Basic) {
    return; // that was it
  }
  auto* origin = inst->origin;
  while (1) {
    i++;
    assert(i < insts.size());
    inst = insts[i];
    insts[i] = nullptr;
    if (inst && inst->origin == origin && isControlFlowEnd(inst)) {
      return; // that's it, we removed it all
    }
  }
}